

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMD::SPFMethod::selectMolecule(SPFMethod *this)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  long *plVar4;
  uint uVar5;
  pointer pOVar6;
  ulong uVar7;
  long lVar8;
  uint __len;
  shared_ptr<OpenMD::SPFData> spfData;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<OpenMD::SPFData> local_90;
  shared_ptr<OpenMD::SPFData> local_80;
  undefined1 local_70 [24];
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  Snapshot::getSPFData((this->super_RNEMD).currentSnap_);
  this->spfTarget_ = (this->super_RNEMD).particleTarget_;
  if (*(int *)(local_a0 + 0x20) == -1) {
    local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    bVar3 = setSelectedMolecule(this,&local_80);
    if (local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar3) {
      this->failedLastTrial_ = true;
      bVar3 = false;
      goto LAB_00230c17;
    }
  }
  else {
    local_90.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    getSelectedMolecule(this,&local_90);
    if (local_90.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  uVar1 = *(uint *)(local_a0 + 0x20);
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00230aec;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00230aec;
      }
      if (uVar5 < 10000) goto LAB_00230aec;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00230aec:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_50[0]),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x29cb39);
  pOVar6 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pOVar6) {
    local_70._16_8_ =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_58 = plVar4[3];
    local_70._0_8_ = (pointer)(local_70 + 0x10);
  }
  else {
    local_70._16_8_ =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_70._0_8_ = (pointer)*plVar4;
  }
  local_70._8_8_ = plVar4[1];
  *plVar4 = (long)pOVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->selectedMoleculeStr_,(string *)local_70);
  if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_70._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  SelectionEvaluator::loadScriptString
            (&this->selectedMoleculeEvaluator_,&this->selectedMoleculeStr_);
  SelectionEvaluator::evaluate((SelectionSet *)local_70,&this->selectedMoleculeEvaluator_);
  lVar8 = 0;
  do {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar8),
               (vector<bool,_std::allocator<bool>_> *)
               ((long)&(((vector<bool,_std::allocator<bool>_> *)local_70._0_8_)->
                       super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p + lVar8));
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0xf0);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_70);
  bVar3 = true;
LAB_00230c17:
  this->forceManager_->hasSelectedMolecule_ = bVar3;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

void SPFMethod::selectMolecule() {
    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    // Always reset spfTarget_ before selecting a new particle
    spfTarget_ = particleTarget_;

    bool hasSelectedMolecule = (spfData->globalID == -1) ?
                                   setSelectedMolecule(spfData) :
                                   getSelectedMolecule(spfData);

    if (hasSelectedMolecule) {
      selectedMoleculeStr_ = "select " + std::to_string(spfData->globalID);

      selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
      selectedMoleculeMan_.setSelectionSet(
          selectedMoleculeEvaluator_.evaluate());

#ifdef IS_MPI
      MPI_Bcast(&spfTarget_, 1, MPI_REALTYPE,
                info_->getMolToProc(spfData->globalID), MPI_COMM_WORLD);
#endif
    } else {
      failedLastTrial_ = true;
    }

    forceManager_->setHasSelectedMolecule(hasSelectedMolecule);
  }